

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O3

void TestCRLReparse(Span<const_unsigned_char> der)

{
  OPENSSL_STACK *pOVar1;
  int iVar2;
  size_t sVar3;
  X509_CRL *pXVar4;
  X509_CRL *pXVar5;
  PKCS7 *__p;
  pointer *__ptr;
  __uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  initial_capacity;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  AssertHelperData *pAVar7;
  undefined1 auVar8 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdVar9;
  char *message;
  pointer pcVar10;
  char *in_R9;
  ulong uVar11;
  pointer *__ptr_2;
  uint8_t *ptr;
  UniquePtr<uint8_t> free_result2_data;
  UniquePtr<uint8_t> free_result_data;
  UniquePtr<struct_stack_st_X509_CRL> crls;
  UniquePtr<PKCS7> pkcs7_obj;
  CBS pkcs7;
  UniquePtr<struct_stack_st_X509_CRL> crls2;
  ScopedCBB cbb;
  size_t result_len;
  uint8_t *result_data;
  size_t result2_len;
  uint8_t *result2_data;
  undefined1 local_108 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f8;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  Bytes local_d0;
  __uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> local_c0;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  _Head_base<0UL,_stack_st_X509_CRL_*,_false> local_a8;
  _Head_base<0UL,_PKCS7_*,_false> local_a0;
  CBS local_98;
  _Head_base<0UL,_stack_st_X509_CRL_*,_false> local_88;
  undefined1 local_80 [16];
  anon_union_32_2_4f6aaa2e_for_u local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  size_t local_40;
  _Head_base<0UL,_unsigned_char_*,_false> local_38;
  
  initial_capacity.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )der.size_;
  pAVar7 = (AssertHelperData *)der.data_;
  local_a8._M_head_impl = (stack_st_X509_CRL *)OPENSSL_sk_new_null();
  local_f0[0] = (internal)((OPENSSL_STACK *)local_a8._M_head_impl != (OPENSSL_STACK *)0x0);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((OPENSSL_STACK *)local_a8._M_head_impl == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_f0,(AssertionResult *)0x55b9ee,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xad,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]),
                      (ulong)(local_70.base.buf + 1));
    }
    if ((AssertHelperData *)local_98.data != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_98.data + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
    goto LAB_0033dcb3;
  }
  local_88._M_head_impl = (stack_st_X509_CRL *)OPENSSL_sk_new_null();
  local_f0[0] = (internal)((OPENSSL_STACK *)local_88._M_head_impl != (OPENSSL_STACK *)0x0);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((OPENSSL_STACK *)local_88._M_head_impl == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_f0,(AssertionResult *)"crls2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0xaf,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    auVar8 = (undefined1  [8])local_98.data;
    if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]),
                      (ulong)(local_70.base.buf + 1));
      auVar8 = (undefined1  [8])local_98.data;
    }
LAB_0033d54a:
    if (auVar8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auVar8 + 8))();
    }
    if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8,local_e8);
    }
  }
  else {
    local_98.data = (uint8_t *)pAVar7;
    local_98.len = (size_t)initial_capacity.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
    iVar2 = PKCS7_get_CRLs(local_a8._M_head_impl,&local_98);
    local_f0[0] = (internal)(iVar2 != 0);
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_80,(internal *)local_f0,
                 (AssertionResult *)"PKCS7_get_CRLs(crls.get(), &pkcs7)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb4,(char *)CONCAT71(local_80._1_7_,local_80[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
      auVar8 = local_108;
      if ((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
        operator_delete((anon_union_32_2_4f6aaa2e_for_u *)CONCAT71(local_80._1_7_,local_80[0]),
                        (ulong)(local_70.base.buf + 1));
        auVar8 = local_108;
      }
      goto LAB_0033d54a;
    }
    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
    local_f0 = (undefined1  [8])local_98.len;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_80,"0u","CBS_len(&pkcs7)",(uint *)local_108,
               (unsigned_long *)local_f0);
    if (local_80[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_f0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((_Alloc_hider *)local_80._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb5,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
      if (local_f0 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_f0 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_80 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_80._8_8_);
    }
    CBB_zero((CBB *)local_80);
    iVar2 = CBB_init((CBB *)local_80,
                     (size_t)initial_capacity.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    local_108[0] = iVar2 != 0;
    local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f0,(internal *)local_108,
                 (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0xb8,(char *)local_f0);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
LAB_0033d81b:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if (local_f0 != (undefined1  [8])&local_e0) {
        operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
      }
      if ((AssertHelperData *)local_d0.span_.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_d0.span_.data_ + 8))();
      }
      if (local_100 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
        ;
      }
    }
    else {
      iVar2 = PKCS7_bundle_CRLs((CBB *)local_80,local_a8._M_head_impl);
      local_108[0] = iVar2 != 0;
      local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f0,(internal *)local_108,
                   (AssertionResult *)"PKCS7_bundle_CRLs(cbb.get(), crls.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xb9,(char *)local_f0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        goto LAB_0033d81b;
      }
      iVar2 = CBB_finish((CBB *)local_80,(uint8_t **)&local_48,(size_t *)&local_50);
      local_108[0] = iVar2 != 0;
      local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f0,(internal *)local_108,
                   (AssertionResult *)"CBB_finish(cbb.get(), &result_data, &result_len)","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xba,(char *)local_f0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_d0);
        goto LAB_0033d81b;
      }
      local_b0._M_head_impl = local_48._M_head_impl;
      local_98.data = (uint8_t *)local_48._M_head_impl;
      local_98.len = (size_t)local_50;
      iVar2 = PKCS7_get_CRLs(local_88._M_head_impl,&local_98);
      local_108[0] = iVar2 != 0;
      local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f0,(internal *)local_108,
                   (AssertionResult *)"PKCS7_get_CRLs(crls2.get(), &pkcs7)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xbe,(char *)local_f0);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0);
        goto LAB_0033d8cb;
      }
      local_d0.span_.data_ = (uchar *)((ulong)local_d0.span_.data_ & 0xffffffff00000000);
      local_108 = (undefined1  [8])local_98.len;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)local_f0,"0u","CBS_len(&pkcs7)",(uint *)&local_d0,
                 (unsigned_long *)local_108);
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_108);
        if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_e8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xbf,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
        if (local_108 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_108 + 8))();
        }
      }
      if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_e8,local_e8);
      }
      local_108 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl);
      local_d0.span_.data_ = (uchar *)OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_f0,"sk_X509_CRL_num(crls.get())","sk_X509_CRL_num(crls.get())",
                 (unsigned_long *)local_108,(unsigned_long *)&local_d0);
      if (local_f0[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_108);
        if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = "";
        }
        else {
          pcVar10 = (local_e8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                   ,0xc4,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)local_108);
LAB_0033dc62:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
        if (local_108 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_108 + 8))();
        }
        if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_e8;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_e8;
          goto LAB_0033dc8a;
        }
      }
      else {
        if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_e8,local_e8);
        }
        for (uVar11 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl),
            uVar11 < sVar3; uVar11 = uVar11 + 1) {
          pXVar4 = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)local_a8._M_head_impl,uVar11);
          pXVar5 = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)local_88._M_head_impl,uVar11);
          local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
          iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
          local_d0.span_.data_ = (uchar *)CONCAT44(local_d0.span_.data_._4_4_,iVar2);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_f0,"0","X509_CRL_cmp(a, b)",(int *)local_108,(int *)&local_d0
                    );
          if (local_f0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_108);
            if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar10 = "";
            }
            else {
              pcVar10 = (local_e8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_d0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,200,pcVar10);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_d0,(Message *)local_108);
            goto LAB_0033dc62;
          }
          if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_e8,local_e8);
          }
        }
        iVar2 = CBB_init((CBB *)local_80,
                         (size_t)initial_capacity.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
        local_108[0] = iVar2 != 0;
        local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_d0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f0,(internal *)local_108,
                     (AssertionResult *)"CBB_init(cbb.get(), der.size())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                     ,0xcb,(char *)local_f0);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_d0)
          ;
        }
        else {
          iVar2 = PKCS7_bundle_CRLs((CBB *)local_80,local_88._M_head_impl);
          local_108[0] = iVar2 != 0;
          local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f0,(internal *)local_108,
                       (AssertionResult *)"PKCS7_bundle_CRLs(cbb.get(), crls2.get())","false","true"
                       ,in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0xcc,(char *)local_f0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c0,(Message *)&local_d0);
          }
          else {
            iVar2 = CBB_finish((CBB *)local_80,&local_38._M_head_impl,&local_40);
            local_108[0] = iVar2 != 0;
            local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
            if (iVar2 != 0) {
              local_c0._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)
                   (tuple<unsigned_char_*,_bssl::internal::Deleter>)local_38._M_head_impl;
              local_108 = (undefined1  [8])local_48._M_head_impl;
              local_100 = local_50;
              local_d0.span_.data_ = local_38._M_head_impl;
              local_d0.span_.size_ = local_40;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)local_f0,"Bytes(result_data, result_len)",
                         "Bytes(result2_data, result2_len)",(Bytes *)local_108,&local_d0);
              if (local_f0[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_108);
                if (local_e8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = (local_e8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xd0,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_d0,(Message *)local_108);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
                if (local_108 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_108 + 8))();
                }
              }
              if (local_e8 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_e8,local_e8);
              }
              local_d0.span_.data_ = (uchar *)pAVar7;
              local_a0._M_head_impl =
                   (PKCS7 *)d2i_PKCS7((PKCS7 **)0x0,(uchar **)&local_d0,
                                      (long)initial_capacity.
                                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
              local_108[0] = (PKCS7 *)local_a0._M_head_impl != (PKCS7 *)0x0;
              local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
              if ((PKCS7 *)local_a0._M_head_impl == (PKCS7 *)0x0) {
                testing::Message::Message((Message *)&local_f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_f0,(internal *)local_108,(AssertionResult *)"pkcs7_obj",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_b8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xd5,(char *)local_f0);
                testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
LAB_0033e0a2:
                pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_100;
                testing::internal::AssertHelper::~AssertHelper(&local_b8);
                if (local_f0 != (undefined1  [8])&local_e0) {
                  operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                }
                if (local_f8._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_f8._M_head_impl + 8))();
                }
                paVar6 = local_100;
                if (local_100 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
LAB_0033e2bb:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)paVar6);
                }
              }
              else {
                local_108 = (undefined1  [8])
                            ((long)&pAVar7->type +
                            (long)initial_capacity.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl);
                testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char_const*>
                          ((internal *)local_f0,"ptr","der.data() + der.size()",(uchar **)&local_d0,
                           (uchar **)local_108);
                if (local_f0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)local_108);
                  if (local_e8 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar10 = "";
                  }
                  else {
                    pcVar10 = (local_e8->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_f8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0xd6,pcVar10);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_f8,(Message *)local_108);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
                  if (local_108 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_108 + 8))();
                  }
                }
                if (local_e8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_e8,local_e8);
                }
                iVar2 = PKCS7_type_is_signed(local_a0._M_head_impl);
                local_108[0] = iVar2 != 0;
                local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_f8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_f0,(internal *)local_108,
                             (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_b8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                             ,0xd8,(char *)local_f0);
                  testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
                  goto LAB_0033e0a2;
                }
                pOVar1 = (OPENSSL_STACK *)((ASN1_OBJECT *)((local_a0._M_head_impl)->d).sign)->ln;
                local_108 = (undefined1  [8])OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl);
                local_f8._M_head_impl =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     OPENSSL_sk_num(pOVar1);
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                          ((internal *)local_f0,"sk_X509_CRL_num(crls.get())",
                           "sk_X509_CRL_num(crls3)",(unsigned_long *)local_108,
                           (unsigned_long *)&local_f8);
                if (local_f0[0] != (internal)0x0) {
                  if (local_e8 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_e8,local_e8);
                  }
                  for (uVar11 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl),
                      uVar11 < sVar3; uVar11 = uVar11 + 1) {
                    pXVar4 = (X509_CRL *)
                             OPENSSL_sk_value((OPENSSL_STACK *)local_a8._M_head_impl,uVar11);
                    pXVar5 = (X509_CRL *)OPENSSL_sk_value(pOVar1,uVar11);
                    local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
                    iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
                    local_f8._M_head_impl._0_4_ = iVar2;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)local_f0,"0","X509_CRL_cmp(a, b)",(int *)local_108,
                               (int *)&local_f8);
                    if (local_f0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_e8 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar10 = "";
                      }
                      else {
                        pcVar10 = (local_e8->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_f8,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                 ,0xde,pcVar10);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_f8,(Message *)local_108);
                      goto LAB_0033e293;
                    }
                    if (local_e8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_e8,local_e8);
                    }
                  }
                  local_d0.span_.data_ = (uchar *)local_48._M_head_impl;
                  __p = d2i_PKCS7((PKCS7 **)0x0,(uchar **)&local_d0,(long)local_50);
                  std::__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<PKCS7,_bssl::internal::Deleter> *)&local_a0,
                             (pointer)__p);
                  local_108[0] = (PKCS7 *)local_a0._M_head_impl != (PKCS7 *)0x0;
                  local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x0;
                  if ((PKCS7 *)local_a0._M_head_impl == (PKCS7 *)0x0) {
                    testing::Message::Message((Message *)&local_f8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_f0,(internal *)local_108,
                               (AssertionResult *)"pkcs7_obj","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0xe3,(char *)local_f0);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
                  }
                  else {
                    local_108 = (undefined1  [8])
                                ((long)local_50 + (long)&(local_48._M_head_impl)->field_0x0);
                    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
                              ((internal *)local_f0,"ptr","result_data + result_len",
                               (uchar **)&local_d0,(uchar **)local_108);
                    if (local_f0[0] == (internal)0x0) {
                      testing::Message::Message((Message *)local_108);
                      if (local_e8 ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar10 = "";
                      }
                      else {
                        pcVar10 = (local_e8->_M_dataplus)._M_p;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_f8,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                 ,0xe4,pcVar10);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_f8,(Message *)local_108);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
                      if (local_108 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_108 + 8))();
                      }
                    }
                    if (local_e8 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_e8,local_e8);
                    }
                    iVar2 = PKCS7_type_is_signed(local_a0._M_head_impl);
                    local_108[0] = iVar2 != 0;
                    local_100 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x0;
                    if (iVar2 != 0) {
                      pOVar1 = (OPENSSL_STACK *)
                               ((ASN1_OBJECT *)((local_a0._M_head_impl)->d).sign)->ln;
                      local_108 = (undefined1  [8])
                                  OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl);
                      local_f8._M_head_impl =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)OPENSSL_sk_num(pOVar1);
                      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                                ((internal *)local_f0,"sk_X509_CRL_num(crls.get())",
                                 "sk_X509_CRL_num(crls4)",(unsigned_long *)local_108,
                                 (unsigned_long *)&local_f8);
                      if (local_f0[0] == (internal)0x0) {
                        testing::Message::Message((Message *)local_108);
                        if (local_e8 ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          pcVar10 = "";
                        }
                        else {
                          pcVar10 = (local_e8->_M_dataplus)._M_p;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&local_f8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                   ,0xe8,pcVar10);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&local_f8,(Message *)local_108);
                        goto LAB_0033e293;
                      }
                      if (local_e8 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_e8,local_e8);
                      }
                      for (uVar11 = 0;
                          sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_a8._M_head_impl),
                          uVar11 < sVar3; uVar11 = uVar11 + 1) {
                        pXVar4 = (X509_CRL *)
                                 OPENSSL_sk_value((OPENSSL_STACK *)local_a8._M_head_impl,uVar11);
                        pXVar5 = (X509_CRL *)OPENSSL_sk_value(pOVar1,uVar11);
                        local_108 = (undefined1  [8])((ulong)local_108 & 0xffffffff00000000);
                        iVar2 = X509_CRL_cmp(pXVar4,pXVar5);
                        local_f8._M_head_impl._0_4_ = iVar2;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)local_f0,"0","X509_CRL_cmp(a, b)",(int *)local_108,
                                   (int *)&local_f8);
                        if (local_f0[0] == (internal)0x0) {
                          testing::Message::Message((Message *)local_108);
                          if (local_e8 ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar10 = "";
                          }
                          else {
                            pcVar10 = (local_e8->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&local_f8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                                     ,0xec,pcVar10);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&local_f8,(Message *)local_108);
                          goto LAB_0033e293;
                        }
                        if (local_e8 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_e8,local_e8);
                        }
                      }
                      goto LAB_0033e2c0;
                    }
                    testing::Message::Message((Message *)&local_f8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_f0,(internal *)local_108,
                               (AssertionResult *)"PKCS7_type_is_signed(pkcs7_obj.get())","false",
                               "true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_b8,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                               ,0xe6,(char *)local_f0);
                    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f8);
                  }
                  goto LAB_0033e0a2;
                }
                testing::Message::Message((Message *)local_108);
                if (local_e8 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar10 = "";
                }
                else {
                  pcVar10 = (local_e8->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_f8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                           ,0xda,pcVar10);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_f8,(Message *)local_108);
LAB_0033e293:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
                if (local_108 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_108 + 8))();
                }
                if (local_e8 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_e8;
                  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_e8;
                  goto LAB_0033e2bb;
                }
              }
LAB_0033e2c0:
              std::unique_ptr<PKCS7,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<PKCS7,_bssl::internal::Deleter> *)&local_a0);
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_c0);
              goto LAB_0033dc8f;
            }
            testing::Message::Message((Message *)&local_d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_f0,(internal *)local_108,
                       (AssertionResult *)"CBB_finish(cbb.get(), &result2_data, &result2_len)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                       ,0xcd,(char *)local_f0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_c0,(Message *)&local_d0);
          }
        }
LAB_0033d8cb:
        pdVar9 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
        if (local_f0 != (undefined1  [8])&local_e0) {
          operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
        }
        if ((AssertHelperData *)local_d0.span_.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.span_.data_ + 8))();
        }
        paVar6 = local_100;
        if (local_100 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_0033dc8a:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(pdVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              paVar6);
        }
      }
LAB_0033dc8f:
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&local_b0);
    }
    CBB_cleanup((CBB *)local_80);
  }
  std::unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter> *)&local_88);
LAB_0033dcb3:
  std::unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509_CRL,_bssl::internal::Deleter> *)&local_a8);
  return;
}

Assistant:

static void TestCRLReparse(bssl::Span<const uint8_t> der) {
  bssl::UniquePtr<STACK_OF(X509_CRL)> crls(sk_X509_CRL_new_null());
  ASSERT_TRUE(crls);
  bssl::UniquePtr<STACK_OF(X509_CRL)> crls2(sk_X509_CRL_new_null());
  ASSERT_TRUE(crls2);
  uint8_t *result_data, *result2_data;
  size_t result_len, result2_len;

  CBS pkcs7 = der;
  ASSERT_TRUE(PKCS7_get_CRLs(crls.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  bssl::ScopedCBB cbb;
  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_CRLs(cbb.get(), crls.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result_data, &result_len));
  bssl::UniquePtr<uint8_t> free_result_data(result_data);

  CBS_init(&pkcs7, result_data, result_len);
  ASSERT_TRUE(PKCS7_get_CRLs(crls2.get(), &pkcs7));
  EXPECT_EQ(0u, CBS_len(&pkcs7));

  // PKCS#7 stores CRLs in a SET OF, so |PKCS7_bundle_CRLs| may not preserve the
  // original order. All of our test inputs are already sorted, but this check
  // should be relaxed if we add others.
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls.get()));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls2.get(), i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }

  ASSERT_TRUE(CBB_init(cbb.get(), der.size()));
  ASSERT_TRUE(PKCS7_bundle_CRLs(cbb.get(), crls2.get()));
  ASSERT_TRUE(CBB_finish(cbb.get(), &result2_data, &result2_len));
  bssl::UniquePtr<uint8_t> free_result2_data(result2_data);

  EXPECT_EQ(Bytes(result_data, result_len), Bytes(result2_data, result2_len));

  // Parse with the legacy API instead.
  const uint8_t *ptr = der.data();
  bssl::UniquePtr<PKCS7> pkcs7_obj(d2i_PKCS7(nullptr, &ptr, der.size()));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, der.data() + der.size());

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509_CRL) *crls3 = pkcs7_obj->d.sign->crl;
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls3));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls3, i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }

  ptr = result_data;
  pkcs7_obj.reset(d2i_PKCS7(nullptr, &ptr, result_len));
  ASSERT_TRUE(pkcs7_obj);
  EXPECT_EQ(ptr, result_data + result_len);

  ASSERT_TRUE(PKCS7_type_is_signed(pkcs7_obj.get()));
  const STACK_OF(X509_CRL) *crls4 = pkcs7_obj->d.sign->crl;
  ASSERT_EQ(sk_X509_CRL_num(crls.get()), sk_X509_CRL_num(crls4));
  for (size_t i = 0; i < sk_X509_CRL_num(crls.get()); i++) {
    X509_CRL *a = sk_X509_CRL_value(crls.get(), i);
    X509_CRL *b = sk_X509_CRL_value(crls4, i);
    ASSERT_EQ(0, X509_CRL_cmp(a, b));
  }
}